

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O3

iter_type __thiscall
booster::locale::util::base_num_parse<char>::do_real_get<long_double>
          (base_num_parse<char> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          longdouble *val)

{
  undefined1 auVar1 [12];
  ios_info *this_00;
  uint64_t uVar2;
  streambuf_type *psVar3;
  ulong uVar4;
  iter_type iVar5;
  iter_type iVar6;
  iter_type in_00;
  undefined1 auVar7 [12];
  iter_type end_00;
  iter_type end_01;
  locale local_1c0;
  stringstream ss;
  undefined8 auStack_1b0 [2];
  undefined4 auStack_1a0 [26];
  ios_base local_138 [264];
  
  this_00 = ios_info::get(ios);
  uVar2 = ios_info::display_flags(this_00);
  if (uVar2 != 2) {
    if (uVar2 != 0) {
      iVar5 = (iter_type)
              std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                        (this,in._M_sbuf,in._M_c,end._M_sbuf,end._M_c,ios);
      return iVar5;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::locale::classic();
    std::ios::imbue(&local_1c0);
    std::locale::~locale(&local_1c0);
    *(undefined4 *)((long)auStack_1a0 + *(long *)(_ss + -0x18)) = *(undefined4 *)(ios + 0x18);
    *(undefined8 *)((long)auStack_1b0 + *(long *)(_ss + -0x18)) = *(undefined8 *)(ios + 8);
    auVar7 = std::num_get<char,std::istreambuf_iterator<char,std::char_traits<char>>>::do_get
                       (this,in._M_sbuf,in._M_c,end._M_sbuf,end._M_c,
                        (stringstream *)&ss + *(long *)(_ss + -0x18),err,val);
    psVar3 = auVar7._0_8_;
    uVar4 = (ulong)auVar7._8_4_;
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
    goto LAB_0019fcde;
  }
  _ss = (longdouble)0;
  uVar2 = ios_info::currency_flags(this_00);
  auVar7 = in._0_12_;
  auVar1 = end._0_12_;
  if (uVar2 == 0) {
LAB_0019fc4d:
    in_00._12_4_ = 0;
    in_00._M_sbuf = (streambuf_type *)auVar7._0_8_;
    in_00._M_c = auVar7._8_4_;
    end_00._12_4_ = 0;
    end_00._M_sbuf = (streambuf_type *)auVar1._0_8_;
    end_00._M_c = auVar1._8_4_;
    iVar5 = parse_currency<false>(this,in_00,end_00,ios,err,(longdouble *)&ss);
    auVar7 = iVar5._0_12_;
  }
  else {
    uVar2 = ios_info::currency_flags(this_00);
    if (uVar2 == 0x40) goto LAB_0019fc4d;
    iVar5._12_4_ = 0;
    iVar5._M_sbuf = (streambuf_type *)auVar7._0_8_;
    iVar5._M_c = auVar7._8_4_;
    end_01._12_4_ = 0;
    end_01._M_sbuf = (streambuf_type *)auVar1._0_8_;
    end_01._M_c = auVar1._8_4_;
    iVar5 = parse_currency<true>(this,iVar5,end_01,ios,err,(longdouble *)&ss);
    auVar7 = iVar5._0_12_;
  }
  psVar3 = auVar7._0_8_;
  uVar4 = (ulong)auVar7._8_4_;
  if ((*err & _S_failbit) == _S_goodbit) {
    *val = _ss;
  }
LAB_0019fcde:
  iVar6._8_8_ = uVar4;
  iVar6._M_sbuf = psVar3;
  return iVar6;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        typedef std::num_get<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                std::stringstream ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                return super::do_get(in,end,ss,err,val);
            }
        case flags::currency:
            {
                long double ret_val = 0;
                if(info.currency_flags()==flags::currency_default || info.currency_flags() == flags::currency_national)
                    in = parse_currency<false>(in,end,ios,err,ret_val);
                else
                    in = parse_currency<true>(in,end,ios,err,ret_val);
                if(!(err & std::ios_base::failbit))
                    val = static_cast<ValueType>(ret_val);
                return in;
            }

        // date-time parsing is not supported
        // due to buggy standard
        case flags::date:
        case flags::time:
        case flags::datetime:
        case flags::strftime:

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_get(in,end,ios,err,val);
        }
    }